

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QArrayDataPointer<bool> *
QArrayDataPointer<bool>::allocateGrow
          (QArrayDataPointer<bool> *__return_storage_ptr__,QArrayDataPointer<bool> *from,qsizetype n
          ,GrowthPosition position)

{
  Data *pDVar1;
  bool *pbVar2;
  bool *pbVar3;
  long lVar4;
  Int IVar5;
  qsizetype qVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = from->d;
  if (pDVar1 == (Data *)0x0) {
    qVar6 = 0;
  }
  else {
    qVar6 = (pDVar1->super_QArrayData).alloc;
  }
  lVar4 = from->size;
  if (qVar6 < lVar4) {
    qVar6 = lVar4;
  }
  if (position == GrowsAtEnd) {
    if (pDVar1 == (Data *)0x0) {
      pbVar2 = (bool *)0x0;
    }
    else {
      pbVar2 = from->ptr +
               (lVar4 - (((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                         ) + (pDVar1->super_QArrayData).alloc));
    }
  }
  else {
    pbVar2 = (bool *)(((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) -
                     (long)from->ptr);
    if (pDVar1 == (Data *)0x0) {
      pbVar2 = (bool *)0x0;
    }
  }
  pbVar2 = pbVar2 + qVar6 + n;
  if (pDVar1 != (Data *)0x0) {
    pbVar3 = (bool *)(pDVar1->super_QArrayData).alloc;
    if ((long)pbVar3 <= (long)pbVar2) {
      pbVar3 = pbVar2;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
      pbVar2 = pbVar3;
    }
  }
  if (pDVar1 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar1->super_QArrayData).alloc;
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pbVar2 = (bool *)QArrayData::allocate1(&local_38,(qsizetype)pbVar2,(uint)((long)pbVar2 <= lVar4));
  if (pbVar2 != (bool *)0x0 && local_38 != (QArrayData *)0x0) {
    if (position == GrowsAtBeginning) {
      lVar7 = (local_38->alloc - (from->size + n)) / 2;
      lVar4 = 0;
      if (0 < lVar7) {
        lVar4 = lVar7;
      }
      lVar4 = lVar4 + n;
    }
    else {
      lVar4 = (long)from->ptr -
              ((ulong)((long)&from->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
      if (from->d == (Data *)0x0) {
        lVar4 = 0;
      }
    }
    if (from->d == (Data *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = (from->d->super_QArrayData).flags.
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pbVar2 = pbVar2 + lVar4;
    (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
  }
  __return_storage_ptr__->d = (Data *)local_38;
  __return_storage_ptr__->ptr = pbVar2;
  __return_storage_ptr__->size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }